

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O1

void __thiscall
PolygonTriangulation::thread_endpoints
          (PolygonTriangulation *this,uint32_t segment_index,uint32_t max_y_index,
          uint32_t min_y_index)

{
  Trapezoid_t *trapezoid;
  Trapezoid_t *trapezoid_00;
  QNode_t *right_fusion_node;
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  vertex_t *pvVar4;
  pointer pTVar5;
  pointer pQVar6;
  QNode_t *pQVar7;
  double dVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  bool bVar15;
  uint32_t trapezoid_index;
  uint32_t *puVar16;
  ulong uVar17;
  ulong uVar18;
  vertex_t v;
  vertex_t local_40;
  
  pvVar4 = this->vertices_;
  local_40.x = pvVar4[min_y_index].x - pvVar4[max_y_index].x;
  local_40.y = pvVar4[min_y_index].y - pvVar4[max_y_index].y;
  dVar8 = local_40.x * local_40.x + local_40.y * local_40.y;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  dVar8 = (1.0 / dVar8) * 0.001;
  local_40.x = local_40.x * dVar8 + pvVar4[max_y_index].x;
  local_40.y = dVar8 * local_40.y + pvVar4[max_y_index].y;
  trapezoid_index =
       search_trapezoid_index
                 (this,&local_40,
                  (this->vertex_ynodes_).
                  super__Vector_base<PolygonTriangulation::QNode_t_*,_std::allocator<PolygonTriangulation::QNode_t_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[max_y_index]);
  uVar1 = this->used_trapezoid_count_;
  uVar18 = (ulong)uVar1;
  this->used_trapezoid_count_ = uVar1 + 1;
  pTVar5 = (this->trapezoids_).
           super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  trapezoid = pTVar5 + trapezoid_index;
  trapezoid_00 = pTVar5 + uVar18;
  trapezoid_00->sink = trapezoid->sink;
  uVar11 = trapezoid->max_y;
  uVar12 = trapezoid->min_y;
  uVar13 = trapezoid->left_segment;
  uVar14 = trapezoid->right_segment;
  uVar2 = trapezoid->above2;
  uVar9 = trapezoid->below1;
  uVar10 = trapezoid->below2;
  trapezoid_00->above1 = trapezoid->above1;
  trapezoid_00->above2 = uVar2;
  trapezoid_00->below1 = uVar9;
  trapezoid_00->below2 = uVar10;
  trapezoid_00->max_y = uVar11;
  trapezoid_00->min_y = uVar12;
  trapezoid_00->left_segment = uVar13;
  trapezoid_00->right_segment = uVar14;
  if ((ulong)trapezoid->above2 == 0xffffffff) {
    puVar16 = &(this->trapezoids_).
               super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
               ._M_impl.super__Vector_impl_data._M_start[trapezoid->above1].below2;
    uVar2 = *puVar16;
    if ((uVar2 == 0xffffffff) ||
       ((trapezoid_index == uVar2 && (trapezoid->left_segment != 0xffffffff)))) {
      *puVar16 = uVar1;
    }
  }
  else {
    (this->trapezoids_).
    super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
    ._M_impl.super__Vector_impl_data._M_start[trapezoid->above2].below1 = uVar1;
    trapezoid_00->above1 = trapezoid->above2;
  }
  trapezoid->above2 = 0xffffffff;
  trapezoid_00->above2 = 0xffffffff;
  pQVar6 = (this->query_points_).
           super__Vector_base<PolygonTriangulation::QNode_t,_std::allocator<PolygonTriangulation::QNode_t>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar7 = this->root_;
  uVar3 = this->used_node_count_;
  this->used_node_count_ = uVar3 + 1;
  right_fusion_node = pQVar6 + uVar3;
  pQVar6[uVar3].type = SINK;
  pQVar6[uVar3].parent = pQVar7;
  pQVar6[uVar3].key_index = uVar1;
  (this->trapezoids_).
  super__Vector_base<PolygonTriangulation::Trapezoid_t,_std::allocator<PolygonTriangulation::Trapezoid_t>_>
  ._M_impl.super__Vector_impl_data._M_start[uVar18].sink = right_fusion_node;
  if (pQVar7 == (QNode_t *)0x0) {
    this->root_ = right_fusion_node;
  }
  split_merge_trapezoids
            (this,segment_index,min_y_index,trapezoid_index,(QNode_t *)0x0,right_fusion_node);
  bVar15 = is_top_triangle(this,trapezoid);
  uVar17 = (ulong)trapezoid_index;
  if ((!bVar15) && (bVar15 = is_top_triangle(this,trapezoid_00), uVar17 = uVar18, !bVar15)) {
    return;
  }
  pTVar5[uVar17].above1 = 0xffffffff;
  return;
}

Assistant:

void PolygonTriangulation::thread_endpoints(
    const uint32_t segment_index,
    const uint32_t max_y_index,
    const uint32_t min_y_index
) {
  // Recursively split and merge trapezoids intersecting the segment.

  // To find the top trapezoid we need to offset the first vertex in the direction
  // of the segment, to distinct between left/right trapezoids neighbors.
  vertex_t v;
  compute_offset_vertex(max_y_index, min_y_index, v);

  /// @note could be constant instead, by storing two below sinks and a segment for each Y.
  /// furthermore this will prevent a bug when trapzeoid collapse (on same Ys).
  const auto top_trapezoid_index = search_trapezoid_index(v, vertex_ynodes_[max_y_index]); //
  const auto new_trapezoid_index = get_new_trapezoid_index();

  auto &top_trapezoid = trapezoids_[top_trapezoid_index];
  auto &new_trapezoid = trapezoids_[new_trapezoid_index];

  // Copy top trapezoid attributes to the new one.
  new_trapezoid = top_trapezoid;

  // Link first splitted trapezoid to the one above it.
  if (kInvalidIndex != top_trapezoid.above2) {
    trapezoids_[top_trapezoid.above2].below1 = new_trapezoid_index;
    new_trapezoid.above1 = top_trapezoid.above2;
  } else {
    auto &above_trapezoid = trapezoids_[top_trapezoid.above1];

    if (above_trapezoid.below2 == kInvalidIndex) {
      // case 1 : new empty trapezoid
      above_trapezoid.below2 = new_trapezoid_index;
    } else if (   (top_trapezoid_index == above_trapezoid.below2)
               && (kInvalidIndex != top_trapezoid.left_segment)) {
      // case 2 : old right trap will become a triangle
      above_trapezoid.below2 = new_trapezoid_index;
    }
  }
  top_trapezoid.above2 = kInvalidIndex;
  new_trapezoid.above2 = kInvalidIndex;

  // Every threading operation create one new sink, used as the right fusion sink
  // by default.
  auto *new_sink = create_node(SINK, root_, new_trapezoid_index);

#if DEBUG_INFO
  fprintf(stderr, "> split X : %d %d\n", max_y_index, min_y_index);
#endif
  split_merge_trapezoids(segment_index, min_y_index, top_trapezoid_index, nullptr, new_sink);

  // Close connections with above trapezoid when one of the start trapezoids
  // (left or right) is a triangle.
  if (is_top_triangle(top_trapezoid)) {
    top_trapezoid.above1 = kInvalidIndex;
  } else if (is_top_triangle(new_trapezoid)) {
    new_trapezoid.above1 = kInvalidIndex;
  }
}